

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkCallFromRoot(CheckerVisitor *this,CallExpr *call)

{
  bool bVar1;
  bool bVar2;
  SQChar *pSVar3;
  pointer pSVar4;
  Node *in_RSI;
  CheckerVisitor *in_RDI;
  TreeOp op;
  reverse_iterator it;
  bool do_report;
  SQChar *fn;
  reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  TreeOp in_stack_ffffffffffffffcc;
  CallExpr *in_stack_ffffffffffffffd0;
  CheckerVisitor *in_stack_ffffffffffffffd8;
  
  if ((((in_RDI->effectsOnly & 1U) == 0) &&
      (pSVar3 = extractFunctionName(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0),
      pSVar3 != (SQChar *)0x0)) &&
     (bVar1 = nameLooksLikeMustBeCalledFromRoot((SQChar *)0x18d391), bVar1)) {
    bVar1 = false;
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::rbegin((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    while( true ) {
      std::
      vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ::rend((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)in_RDI,in_stack_ffffffffffffffb8);
      if (!bVar2) break;
      pSVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                             *)in_RDI);
      if (pSVar4->sst != SST_TABLE_MEMBER) {
        pSVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)in_RDI);
        in_stack_ffffffffffffffcc = Node::op((pSVar4->field_1).n);
        if (((in_stack_ffffffffffffffcc == TO_FUNCTION) || (in_stack_ffffffffffffffcc == TO_CLASS))
           || (in_stack_ffffffffffffffcc == TO_CONSTRUCTOR)) {
          bVar1 = true;
          break;
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                    *)in_RDI);
    }
    if (bVar1) {
      report(in_RDI,in_RSI,0x83,pSVar3);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCallFromRoot(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *fn = extractFunctionName(call);

  if (!fn)
    return;

  if (!nameLooksLikeMustBeCalledFromRoot(fn)) {
    return;
  }

  bool do_report = false;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst == SST_TABLE_MEMBER)
      continue;

    enum TreeOp op = it->n->op();

    if (op == TO_FUNCTION || op == TO_CLASS || op == TO_CONSTRUCTOR) {
      do_report = true;
      break;
    }
  }

  if (do_report) {
    report(call, DiagnosticsId::DI_CALL_FROM_ROOT, fn);
  }
}